

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitmapDevice.cpp
# Opt level: O3

void __thiscall
TRM::BitmapDevice::Triangle
          (BitmapDevice *this,Vec3f *a,Vec3f *b,Vec3f *c,Color *ca,Color *cb,Color *cc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  uint32_t uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  element_type *peVar23;
  pointer pfVar24;
  char cVar25;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  undefined1 auVar33 [16];
  undefined6 uVar34;
  undefined8 uVar35;
  unkbyte10 Var36;
  undefined1 auVar37 [12];
  undefined1 auVar38 [14];
  short sVar39;
  undefined4 uVar40;
  float fVar41;
  undefined1 auVar42 [13];
  undefined1 auVar43 [13];
  bool bVar44;
  float *pfVar45;
  long lVar46;
  ulong uVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  long lVar53;
  int iVar54;
  int iVar55;
  bool bVar56;
  float *pfVar57;
  int iVar58;
  int iVar59;
  undefined1 uVar60;
  undefined1 uVar61;
  undefined1 uVar62;
  undefined1 uVar63;
  undefined1 uVar64;
  undefined1 uVar65;
  char cVar66;
  undefined1 uVar67;
  undefined1 uVar68;
  undefined1 uVar69;
  char cVar70;
  undefined1 uVar71;
  undefined1 uVar72;
  undefined1 uVar73;
  char cVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar78 [16];
  float fVar79;
  undefined4 uVar80;
  undefined4 uVar81;
  undefined4 uVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  double dVar88;
  float fVar89;
  Color c_1;
  array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL> pts;
  array<unsigned_char,_4UL> local_15c;
  undefined1 local_158 [16];
  float local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  double local_118;
  undefined8 local_110;
  undefined8 local_104;
  undefined8 local_f8;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  float local_88;
  float fStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  char cVar26;
  char cVar27;
  char cVar28;
  
  peVar23 = (this->mBitmap).super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar19 = peVar23->fWidth;
  iVar55 = uVar19 - 1;
  iVar54 = peVar23->fHeight - 1;
  uVar20 = *(uint *)(ca->fRGBA)._M_elems;
  uVar21 = *(uint *)(cb->fRGBA)._M_elems;
  uVar22 = *(uint *)(cc->fRGBA)._M_elems;
  fVar1 = (a->field_0).x;
  fVar2 = (a->field_1).y;
  fVar3 = (a->field_2).z;
  uVar11 = (this->mMatrix).value[0].field_0;
  uVar15 = (this->mMatrix).value[0].field_1;
  uVar64 = 0;
  uVar65 = 0;
  fVar4 = (this->mMatrix).value[0].field_2.z;
  uVar12 = (this->mMatrix).value[1].field_0;
  uVar16 = (this->mMatrix).value[1].field_1;
  fVar5 = (this->mMatrix).value[1].field_2.z;
  uVar13 = (this->mMatrix).value[2].field_0;
  uVar17 = (this->mMatrix).value[2].field_1;
  fVar6 = (this->mMatrix).value[2].field_2.z;
  uVar14 = (this->mMatrix).value[3].field_0;
  uVar18 = (this->mMatrix).value[3].field_1;
  fVar7 = (this->mMatrix).value[3].field_2.z;
  uVar80 = 0;
  uVar81 = 0;
  uVar82 = 0;
  local_48 = ZEXT416((uint)(fVar3 * fVar6 + fVar7 + fVar2 * fVar5 + fVar1 * fVar4));
  fVar83 = fVar3 * (float)uVar13 + (float)uVar14 + fVar2 * (float)uVar12 + fVar1 * (float)uVar11;
  fVar84 = fVar3 * (float)uVar17 + (float)uVar18 + fVar2 * (float)uVar16 + fVar1 * (float)uVar15;
  local_78 = CONCAT44(fVar84,fVar83);
  local_110 = local_78;
  fVar1 = (b->field_0).x;
  fVar2 = (b->field_1).y;
  fVar3 = (b->field_2).z;
  fVar85 = fVar3 * (float)uVar13 + (float)uVar14 + fVar2 * (float)uVar12 + fVar1 * (float)uVar11;
  fStack_b4 = fVar3 * (float)uVar17 + (float)uVar18 + fVar2 * (float)uVar16 + fVar1 * (float)uVar15;
  local_104 = CONCAT44(fStack_b4,fVar85);
  fVar8 = (c->field_0).x;
  fVar9 = (c->field_1).y;
  fVar10 = (c->field_2).z;
  fVar86 = fVar10 * (float)uVar13 + (float)uVar14 + fVar9 * (float)uVar12 + fVar8 * (float)uVar11;
  fVar87 = fVar10 * (float)uVar17 + (float)uVar18 + fVar9 * (float)uVar16 + fVar8 * (float)uVar15;
  local_f8 = CONCAT44(fVar87,fVar86);
  lVar46 = 0;
  iVar59 = 0;
  iVar49 = 0;
  iVar50 = iVar55;
  iVar48 = iVar54;
  do {
    pfVar45 = (float *)((long)&local_110 + lVar46 * 0xc);
    lVar53 = 0;
    bVar44 = true;
    do {
      bVar56 = bVar44;
      iVar58 = iVar59;
      iVar59 = iVar50;
      if (lVar53 != 0) {
        iVar59 = iVar48;
      }
      fVar79 = pfVar45[lVar53];
      if ((float)iVar59 <= fVar79) {
        fVar79 = (float)iVar59;
      }
      if (fVar79 <= 0.0) {
        fVar79 = 0.0;
      }
      pfVar57 = pfVar45;
      iVar59 = (int)fVar79;
      iVar52 = iVar55;
      iVar51 = iVar58;
      if (lVar53 != 0) {
        pfVar57 = (float *)((long)&local_110 + lVar46 * 0xc + 4);
        iVar59 = iVar50;
        iVar48 = (int)fVar79;
        iVar52 = iVar54;
        iVar51 = iVar49;
      }
      iVar50 = iVar59;
      fVar79 = *pfVar57;
      if (*pfVar57 <= (float)iVar51) {
        fVar79 = (float)iVar51;
      }
      if ((float)iVar52 <= fVar79) {
        fVar79 = (float)iVar52;
      }
      iVar52 = (int)fVar79;
      iVar59 = iVar52;
      if (lVar53 != 0) {
        iVar59 = iVar58;
        iVar49 = iVar52;
      }
      lVar53 = 1;
      bVar44 = false;
    } while (bVar56);
    lVar46 = lVar46 + 1;
  } while (lVar46 != 3);
  uVar67 = 0;
  uVar68 = 0;
  uVar69 = 0;
  uVar71 = 0;
  uVar72 = 0;
  uVar73 = 0;
  fVar79 = (float)iVar50;
  uVar60 = SUB41(fVar79,0);
  uVar61 = (undefined1)((uint)fVar79 >> 8);
  uVar62 = (undefined1)((uint)fVar79 >> 0x10);
  uVar63 = (undefined1)((uint)fVar79 >> 0x18);
  if (fVar79 <= (float)iVar58) {
    fVar79 = (float)iVar48;
    fVar86 = fVar86 - fVar83;
    fVar75 = fVar85 - fVar83;
    fVar76 = fVar87 - fVar84;
    fStack_b4 = fStack_b4 - fVar84;
    fVar89 = fStack_b4 * fVar86 - fVar76 * fVar75;
    dVar88 = (double)ABS(fVar89);
    local_c8 = (float)(uVar20 & 0xff);
    fStack_c4 = (float)(uVar20 >> 8 & 0xff);
    fStack_c0 = (float)(uVar20 >> 0x10 & 0xff);
    fStack_bc = (float)(uVar20 >> 0x18);
    auVar43[0xc] = (char)(uVar21 >> 0x18);
    auVar43._0_12_ = ZEXT712(0);
    local_d8 = (float)(uVar21 & 0xff);
    fStack_d4 = (float)(uVar21 >> 8 & 0xff);
    fStack_d0 = (float)(int)CONCAT32(auVar43._10_3_,(ushort)(byte)(uVar21 >> 0x10));
    fStack_cc = (float)(uint3)(auVar43._10_3_ >> 0x10);
    auVar42[0xc] = (char)(uVar22 >> 0x18);
    auVar42._0_12_ = ZEXT712(0);
    local_88 = -(fVar85 - fVar83);
    fVar85 = -fStack_b4;
    local_e8 = (float)(uVar22 & 0xff);
    fStack_e4 = (float)(uVar22 >> 8 & 0xff);
    fStack_e0 = (float)(int)CONCAT32(auVar42._10_3_,(ushort)(byte)(uVar22 >> 0x10));
    fStack_dc = (float)(uint3)(auVar42._10_3_ >> 0x10);
    local_68 = ZEXT416((uint)fVar79);
    uStack_70 = 0;
    uStack_80 = 0x80000000;
    uStack_7c = 0x80000000;
    local_98 = CONCAT44(fVar87 - fVar84,fVar86);
    uStack_90 = 0;
    local_a8 = CONCAT44(fVar75,fVar76);
    uStack_a0 = 0;
    local_118 = dVar88;
    local_b8 = fVar89;
    fStack_b0 = fStack_b4;
    fStack_ac = fStack_b4;
    fStack_84 = fVar85;
    do {
      local_158[1] = uVar61;
      local_158[0] = uVar60;
      local_158[2] = uVar62;
      local_158[3] = uVar63;
      local_158[9] = uVar68;
      local_158[8] = uVar67;
      local_158[10] = uVar69;
      local_158[0xb] = uVar64;
      local_158[0xd] = uVar72;
      local_158[0xc] = uVar71;
      local_158[0xe] = uVar73;
      local_158[0xf] = uVar65;
      local_158._4_4_ = fVar79;
      local_148 = fVar79;
      uStack_144 = uVar80;
      uStack_140 = uVar81;
      uStack_13c = uVar82;
      while (local_148 <= (float)iVar52) {
        local_58._0_12_ = ZEXT812(0x3f800000bf800000);
        local_58._12_4_ = 0;
        local_128 = 1.0;
        fStack_124 = 0.0;
        if (0.01 < dVar88) {
          fVar87 = fVar83 - local_158._0_4_;
          fVar41 = fVar84 - local_158._4_4_;
          fVar77 = fVar87 * fVar76 + fVar86 * -fVar41;
          fStack_124 = fVar41 * fVar75 + fVar87 * fVar85;
          local_58._0_4_ = 1.0 - (fStack_124 + fVar77) / fVar89;
          auVar78._4_8_ = 0;
          auVar78._0_4_ = local_58._0_4_;
          auVar78._12_4_ = fStack_124;
          local_58._8_8_ = auVar78._8_8_;
          local_58._4_4_ = fVar77 / fVar89;
          local_128 = fStack_124 / fVar89;
        }
        if (0.0 <= local_58._0_4_) {
          fVar87 = local_58._4_4_;
          uVar64 = local_58[4];
          uVar65 = local_58[5];
          uVar60 = local_58[6];
          uVar61 = local_58[7];
          local_138[4] = uVar64;
          local_138._0_4_ = fVar87;
          local_138[5] = uVar65;
          local_138[6] = uVar60;
          local_138[7] = uVar61;
          unique0x100001e4 = uVar64;
          unique0x100001e5 = uVar65;
          unique0x100001e6 = uVar60;
          unique0x100001e7 = uVar61;
          unique0x100001e8 = uVar64;
          unique0x100001e9 = uVar65;
          unique0x100001ea = uVar60;
          unique0x100001eb = uVar61;
          if ((0.0 <= fVar87) && (0.0 <= local_128)) {
            fVar77 = local_148 * (float)(int)uVar19 + local_158._0_4_;
            uVar47 = (ulong)fVar77;
            fVar87 = (fVar6 * fVar10 + fVar7 + fVar5 * fVar9 + fVar4 * fVar8) * local_128 +
                     (float)local_48._0_4_ * local_58._0_4_ +
                     (fVar6 * fVar3 + fVar7 + fVar5 * fVar2 + fVar4 * fVar1) * fVar87;
            uVar47 = (long)(fVar77 - 9.223372e+18) & (long)uVar47 >> 0x3f | uVar47;
            pfVar24 = (this->mZBuffer).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pfVar45 = pfVar24 + uVar47;
            if (fVar87 < *pfVar45 || fVar87 == *pfVar45) {
              pfVar24[uVar47] = fVar87;
              fStack_120 = fStack_124;
              fStack_11c = fStack_124;
              Color::Color((Color *)&local_15c);
              iVar49 = (int)(local_128 * local_e8 +
                            (float)local_58._0_4_ * local_c8 + (float)local_138._0_4_ * local_d8);
              iVar50 = (int)(local_128 * fStack_e4 +
                            (float)local_58._0_4_ * fStack_c4 + (float)local_138._4_4_ * fStack_d4);
              cVar66 = (char)((uint)iVar50 >> 0x10);
              iVar48 = (int)(local_128 * fStack_e0 +
                            (float)local_58._0_4_ * fStack_c0 + fStack_130 * fStack_d0);
              cVar70 = (char)((uint)iVar48 >> 0x10);
              iVar59 = (int)(local_128 * fStack_dc +
                            (float)local_58._0_4_ * fStack_bc + fStack_12c * fStack_cc);
              cVar74 = (char)((uint)iVar59 >> 0x10);
              uVar34 = CONCAT15((char)((uint)iVar50 >> 8),CONCAT14((char)iVar50,iVar49));
              uVar35 = CONCAT17((char)((uint)iVar50 >> 0x18),CONCAT16(cVar66,uVar34));
              Var36 = CONCAT19((char)((uint)iVar48 >> 8),CONCAT18((char)iVar48,uVar35));
              auVar37[10] = cVar70;
              auVar37._0_10_ = Var36;
              auVar37[0xb] = (char)((uint)iVar48 >> 0x18);
              auVar38[0xc] = (char)iVar59;
              auVar38._0_12_ = auVar37;
              auVar38[0xd] = (char)((uint)iVar59 >> 8);
              auVar33[0xe] = cVar74;
              auVar33._0_14_ = auVar38;
              auVar33[0xf] = (char)((uint)iVar59 >> 0x18);
              sVar29 = (short)iVar49;
              cVar25 = (0 < sVar29) * (sVar29 < 0x100) * (char)iVar49 - (0xff < sVar29);
              sVar29 = (short)((uint)iVar49 >> 0x10);
              sVar30 = (short)((uint6)uVar34 >> 0x20);
              cVar26 = (0 < sVar30) * (sVar30 < 0x100) * (char)iVar50 - (0xff < sVar30);
              sVar30 = (short)((ulong)uVar35 >> 0x30);
              sVar31 = (short)((unkuint10)Var36 >> 0x40);
              cVar27 = (0 < sVar31) * (sVar31 < 0x100) * (char)iVar48 - (0xff < sVar31);
              sVar31 = auVar37._10_2_;
              sVar32 = auVar38._12_2_;
              cVar28 = (0 < sVar32) * (sVar32 < 0x100) * (char)iVar59 - (0xff < sVar32);
              sVar32 = auVar33._14_2_;
              sVar39 = CONCAT11((0 < sVar29) * (sVar29 < 0x100) * (char)((uint)iVar49 >> 0x10) -
                                (0xff < sVar29),cVar25);
              uVar80 = CONCAT13((0 < sVar30) * (sVar30 < 0x100) * cVar66 - (0xff < sVar30),
                                CONCAT12(cVar26,sVar39));
              uVar34 = CONCAT15((0 < sVar31) * (sVar31 < 0x100) * cVar70 - (0xff < sVar31),
                                CONCAT14(cVar27,uVar80));
              sVar29 = (short)((uint)uVar80 >> 0x10);
              sVar30 = (short)((uint6)uVar34 >> 0x20);
              sVar31 = (short)(CONCAT17((0 < sVar32) * (sVar32 < 0x100) * cVar74 - (0xff < sVar32),
                                        CONCAT16(cVar28,uVar34)) >> 0x30);
              local_15c._M_elems[1] = (0 < sVar29) * (sVar29 < 0x100) * cVar26 - (0xff < sVar29);
              local_15c._M_elems[0] = (0 < sVar39) * (sVar39 < 0x100) * cVar25 - (0xff < sVar39);
              local_15c._M_elems[2] = (0 < sVar30) * (sVar30 < 0x100) * cVar27 - (0xff < sVar30);
              local_15c._M_elems[3] = (0 < sVar31) * (sVar31 < 0x100) * cVar28 - (0xff < sVar31);
              Bitmap::SetPixel((this->mBitmap).
                               super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                               (uint32_t)(long)(float)local_158._0_4_,(uint32_t)(long)local_148,
                               (Color *)&local_15c);
              fVar79 = (float)local_68._0_4_;
              uVar80 = local_68._4_4_;
              uVar81 = local_68._8_4_;
              uVar82 = local_68._12_4_;
              fVar83 = (float)local_78;
              fVar84 = local_78._4_4_;
              fVar85 = fStack_84;
              fVar86 = (float)local_98;
              fVar76 = (float)local_a8;
              fVar75 = local_a8._4_4_;
              fVar89 = local_b8;
              dVar88 = local_118;
            }
          }
        }
        local_148 = local_148 + 1.0;
        uVar40 = local_158._0_4_;
        uVar60 = local_158[0];
        uVar61 = local_158[1];
        uVar62 = local_158[2];
        uVar63 = local_158[3];
        uVar67 = local_158[8];
        uVar68 = local_158[9];
        uVar69 = local_158[10];
        uVar64 = local_158[0xb];
        uVar71 = local_158[0xc];
        uVar72 = local_158[0xd];
        uVar73 = local_158[0xe];
        uVar65 = local_158[0xf];
        local_158._4_4_ = local_148;
        local_158._0_4_ = uVar40;
      }
      fVar87 = (float)CONCAT13(uVar63,CONCAT12(uVar62,CONCAT11(uVar61,uVar60)));
      fVar77 = (float)CONCAT13(uVar63,CONCAT12(uVar62,CONCAT11(uVar61,uVar60))) + 1.0;
      uVar60 = SUB41(fVar77,0);
      uVar61 = (undefined1)((uint)fVar77 >> 8);
      uVar62 = (undefined1)((uint)fVar77 >> 0x10);
      uVar63 = (undefined1)((uint)fVar77 >> 0x18);
    } while (fVar87 + 1.0 <= (float)iVar58);
  }
  return;
}

Assistant:

void BitmapDevice::Triangle(Vec3f const& a, Vec3f const& b, Vec3f const& c,
                            Color const& ca, Color const& cb, Color const& cc) {
  int32_t bitmap_width = mBitmap->width();
  int32_t bitmap_height = mBitmap->height();

  Vec2i bboxmin(bitmap_width - 1, bitmap_height - 1);
  Vec2i bboxmax(0, 0);
  Vec2i clamp(bitmap_width - 1, bitmap_height - 1);

  std::array<Vec3f, 3> pts;
  std::array<Color, 3> colors{ca, cb, cc};

  pts[0] = mMatrix * Vec4f{a.x, a.y, a.z, 1.f};
  pts[1] = mMatrix * Vec4f{b.x, b.y, b.z, 1.f};
  pts[2] = mMatrix * Vec4f{c.x, c.y, c.z, 1.f};

  for (int i = 0; i < 3; i++) {
    for (int j = 0; j < 2; j++) {
      bboxmin[j] = (int)std::max(
          0.f, std::min(static_cast<float>(bboxmin[j]), pts[i][j]));
      bboxmax[j] =
          (int)std::min(static_cast<float>(clamp[j]),
                        std::max(static_cast<float>(bboxmax[j]), pts[i][j]));
    }
  }

  Vec3f p;
  for (p[0] = bboxmin.x; p[0] <= bboxmax.x; p[0]++) {
    for (p[1] = bboxmin.y; p[1] <= bboxmax.y; p[1]++) {
      Vec3f bc_screen = barycentric<3>(pts[0], pts[1], pts[2], p);
      if (bc_screen[0] < 0 || bc_screen[1] < 0 || bc_screen[2] < 0) continue;

      float pz = pts[0][2] * bc_screen[0] + pts[1][2] * bc_screen[1] +
                 pts[2][2] * bc_screen[2];

      size_t zIndex = static_cast<size_t>(p.x + p.y * bitmap_width);
      if (mZBuffer[zIndex] < pz) continue;

      mZBuffer[zIndex] = pz;

      Color c;
      /*
          barycentric result can also interpolation Color
      */

      c.rgba()[0] = bc_screen[0] * colors[0].rgba()[0] +
                    bc_screen[1] * colors[1].rgba()[0] +
                    bc_screen[2] * colors[2].rgba()[0];
      c.rgba()[1] = bc_screen[0] * colors[0].rgba()[1] +
                    bc_screen[1] * colors[1].rgba()[1] +
                    bc_screen[2] * colors[2].rgba()[1];
      c.rgba()[2] = bc_screen[0] * colors[0].rgba()[2] +
                    bc_screen[1] * colors[1].rgba()[2] +
                    bc_screen[2] * colors[2].rgba()[2];
      c.rgba()[3] = bc_screen[0] * colors[0].rgba()[3] +
                    bc_screen[1] * colors[1].rgba()[3] +
                    bc_screen[2] * colors[2].rgba()[3];

      mBitmap->SetPixel(static_cast<uint32_t>(p.x), static_cast<uint32_t>(p.y),
                        c);
    }
  }
}